

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O0

void * FilterRender::render(void *data,uint width,uint height,Config *config)

{
  Filter *pFVar1;
  uint height_00;
  uint width_00;
  void *data_00;
  int iVar2;
  FilterAuto *f_3;
  FilterColor *f_2;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_58;
  Filter *local_40;
  FilterSlicer *f_1;
  FilterFlip *f;
  int i;
  int n;
  Config *config_local;
  uint height_local;
  uint width_local;
  void *data_local;
  
  data_local = data;
  if (config != (Config *)0x0) {
    f._4_4_ = config->nFilters;
    _i = config;
    config_local._0_4_ = height;
    config_local._4_4_ = width;
    _height_local = data;
    for (f._0_4_ = 0; (int)f < (int)f._4_4_; f._0_4_ = (int)f + 1) {
      iVar2 = (**_i->filters[(int)f]->_vptr_Filter)();
      data_00 = _height_local;
      width_00 = config_local._4_4_;
      height_00 = (uint)config_local;
      switch((char)iVar2) {
      case '\0':
        f_1 = (FilterSlicer *)_i->filters[(int)f];
        _height_local =
             doFlip(_height_local,config_local._4_4_,(uint)config_local,
                    (bool)(*(byte *)&(f_1->poly).
                                     super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>
                                     ._M_impl.super__Vector_impl_data._M_start & 1));
        break;
      case '\x01':
        local_40 = _i->filters[(int)f];
        std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector
                  (&local_58,
                   (vector<Geometry::Point,_std::allocator<Geometry::Point>_> *)(local_40 + 1));
        _height_local = doSlice(data_00,width_00,height_00,&local_58);
        std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_58);
        break;
      case '\x02':
        pFVar1 = _i->filters[(int)f];
        _height_local =
             doColor(_height_local,config_local._4_4_,(uint)config_local,
                     *(u_int8_t *)&pFVar1[1]._vptr_Filter,
                     *(u_int8_t *)((long)&pFVar1[1]._vptr_Filter + 1),
                     *(u_int8_t *)((long)&pFVar1[1]._vptr_Filter + 2),
                     *(u_int8_t *)((long)&pFVar1[1]._vptr_Filter + 3));
        break;
      case '\x03':
        _height_local = doAuto(_height_local,config_local._4_4_,(uint)config_local);
      }
    }
    data_local = _height_local;
  }
  return data_local;
}

Assistant:

void* FilterRender::render(void *data, uint width, uint height, Config *config) {

	//data = FilterRender::doColor(data, width, height, time(0)%255, time(0)*2%255, time(0)*3%255, 255);

	if(config == NULL) return data;
	int n = config->nFilters;

	for(int i=0;i<n;++i)
	{
		switch (config->filters[i]->type())
		{
			case 0:
			{
				FilterFlip *f = (FilterFlip*)config->filters[i];
				data = FilterRender::doFlip(data, width, height, f->isLR);
				break;
			}
			case 1:
			{
				FilterSlicer *f = (FilterSlicer*)config->filters[i];
				data = FilterRender::doSlice(data, width, height, f->poly);
				break;
			}
			case 2:
			{
				FilterColor *f = (FilterColor*)config->filters[i];
				data = FilterRender::doColor(data, width, height, f->r, f->g, f->b, f->a);
				break;
			}
			case 3:
			{
				FilterAuto *f = (FilterAuto*)config->filters[i];
				data = FilterRender::doAuto(data, width, height);
				break;
			}

		}

	}
	return data;
}